

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster-messages.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  pointer pvVar2;
  int iVar3;
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  unsigned_long uVar4;
  variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  *pvVar5;
  size_type sVar6;
  size_type __n;
  ostream *poVar7;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar8;
  long lVar9;
  size_t i_1;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  string token;
  string p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  size_type local_2e8;
  unsigned_long i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  unsigned_long local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_278;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  
  if (argc == 2) {
    get_input(&file,2,argv);
    if (file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
        super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index == '\0') {
      pvVar8 = std::get<0ul,int,std::ifstream>(&file);
      iVar3 = *pvVar8;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>(&file);
      tokenize_abi_cxx11_<std::ifstream>(&tokens,file_00);
      local_278._M_buckets = &local_278._M_single_bucket;
      local_278._M_bucket_count = 1;
      local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_278._M_element_count = 0;
      local_278._M_rehash_policy._M_max_load_factor = 1.0;
      local_278._M_rehash_policy._4_4_ = 0;
      local_278._M_rehash_policy._M_next_resize = 0;
      local_278._M_single_bucket = (__node_base_ptr)0x0;
      while (((tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0 &&
             (tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish))) {
        local_2a0 = tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string
                  ((string *)&messages,
                   tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        local_2e8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &messages,':',0);
        if (local_2e8 != 0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &messages,0,local_2e8);
          uVar4 = std::__cxx11::stoul(&p,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&p);
          pbVar1 = messages.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          i = uVar4;
          if (*(char *)((long)&((messages.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       local_2e8 + 2) == '\"') {
            pvVar5 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                      *)std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&local_278,&i);
            std::
            variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            ::operator=(pvVar5,(char *)((long)&(pbVar1->_M_dataplus)._M_p + local_2e8 + 3));
          }
          else {
            local_2e8 = local_2e8 + 2;
            local_2b8.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2b8.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2b8.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            do {
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&messages,'|',local_2e8);
              p._M_dataplus._M_p = (pointer)&p.field_2;
              p._M_string_length = 0;
              p.field_2._M_allocated_capacity = p.field_2._M_allocated_capacity & 0xffffffffffffff00
              ;
              if (sVar6 == 0xffffffffffffffff) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&token,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &messages,local_2e8,0xffffffffffffffff);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&p,&token);
                std::__cxx11::string::~string((string *)&token);
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&token,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &messages,local_2e8,~local_2e8 + sVar6);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&p,&token);
                std::__cxx11::string::~string((string *)&token);
                local_2e8 = sVar6 + 2;
              }
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::emplace_back<>(&local_2b8);
              token._M_dataplus._M_p = (pointer)&token.field_2;
              token._M_string_length = 0;
              token.field_2._M_allocated_capacity =
                   token.field_2._M_allocated_capacity & 0xffffffffffffff00;
              while (__n = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     (&p,' ',0),
                    pvVar2 = local_2b8.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish, __n != 0xffffffffffffffff)
              {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&local_2d8,&p,0,__n);
                iVar3 = std::__cxx11::stoi(&local_2d8,(size_t *)0x0,10);
                local_298 = (unsigned_long)iVar3;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(pvVar2 + -1,&local_298);
                std::__cxx11::string::~string((string *)&local_2d8);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase(&p,0,__n + 1);
              }
              iVar3 = std::__cxx11::stoi(&p,(size_t *)0x0,10);
              local_2d8._M_dataplus._M_p = (pointer)(long)iVar3;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>(pvVar2 + -1,(unsigned_long *)&local_2d8);
              std::__cxx11::string::~string((string *)&token);
              std::__cxx11::string::~string((string *)&p);
            } while (sVar6 != 0xffffffffffffffff);
            pvVar5 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                      *)std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&local_278,&i);
            std::
            variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            ::operator=(pvVar5,&local_2b8);
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::~vector(&local_2b8);
          }
        }
        std::__cxx11::string::~string((string *)&messages);
        tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_2a0 + 1;
      }
      messages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      messages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      messages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::ranges::
      __copy_or_move<false,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                (tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&messages);
      validate(&messages,(rules_t *)&local_278);
      poVar7 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      p._M_dataplus._M_p = (pointer)0x0;
      p._M_string_length = 0;
      p.field_2._M_allocated_capacity = 0;
      token.field_2._M_allocated_capacity = 0;
      token._M_dataplus._M_p = (pointer)0x0;
      token._M_string_length = 0;
      lVar13 = 1;
      for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::emplace_back<>((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&p);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::emplace_back<>((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&token);
        lVar9 = lVar10 * 0x18;
        lVar11 = lVar13;
        while (bVar14 = lVar11 != 0, lVar11 = lVar11 + -1, lVar12 = lVar13, bVar14) {
          local_2d8._M_dataplus._M_p = (pointer)0x2a;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (p._M_dataplus._M_p + lVar9),(unsigned_long *)&local_2d8);
          local_2d8._M_dataplus._M_p = (pointer)0x2a;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (token._M_dataplus._M_p + lVar9),(unsigned_long *)&local_2d8);
        }
        while (lVar12 != 0) {
          local_2d8._M_dataplus._M_p = (pointer)0x1f;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (token._M_dataplus._M_p + lVar9),(unsigned_long *)&local_2d8);
          lVar12 = lVar12 + -1;
        }
        lVar13 = lVar13 + 1;
      }
      local_2d8._M_dataplus._M_p = (pointer)0x8;
      pvVar5 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_278,(key_type *)&local_2d8);
      std::
      variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::operator=(pvVar5,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&p);
      local_2d8._M_dataplus._M_p = (pointer)0xb;
      pvVar5 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_278,(key_type *)&local_2d8);
      std::
      variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::operator=(pvVar5,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&token);
      validate(&messages,(rules_t *)&local_278);
      poVar7 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::operator<<(poVar7,"\n");
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&token);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&messages);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      iVar3 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage((_Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                       *)&file);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar7 = std::operator<<(poVar7,*argv);
    poVar7 = std::operator<<(poVar7," {path-to-file}");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto rules = rules_t {};
  auto it = tokens.cbegin();
  for (; !it->empty() && it != tokens.cend(); it++) {
    auto l = *it;
    size_t eq;
    if ((eq = l.find(':')) != std::string::npos) {
      auto i = std::stoul(l.substr(0, eq));
      if (l[eq+2] == '"') {
        rules[i] = l[eq+3];
      } else {
        auto opts = opts_t {};
        size_t from = eq+2;
        for(;;) {
          size_t to = l.find('|', from);
          std::string p;
          if (to == std::string::npos) {
            p = l.substr(from);
          } else {
            p = l.substr(from, to - from - 1);
            from = to + 2;
          }
          opts.emplace_back();

          size_t pos;
          std::string token;
          while ((pos = p.find(' ')) != std::string::npos) {
            opts.back().push_back(std::stoi(p.substr(0, pos)));
            p.erase(0, pos + 1);
          }
          opts.back().push_back(std::stoi(p));

          if (to == std::string::npos)
            break;
        }
        rules[i] = opts;
      }
    }
  }

  std::vector<std::string> messages;
  ranges::copy(it+1, tokens.cend(), std::back_inserter(messages));

  auto a1 = validate(messages, rules);

  // 170 too low, 185 too high, 184 correct
  std::cout << "Part 1: " << a1 << std::endl;

  // rule 8 encoded by (42|42 42|...|42 42 42 42 42)
  // rule 11 encoded by (42 31|42 42 31 31|...)
  auto r8 = opts_t {}, r11 = opts_t {};
  for (size_t i = 0; i < 5; i++) {
    r8.emplace_back();
    r11.emplace_back();
    for (size_t j = 0; j <= i; j++) {
      r8[i].push_back(42);
      r11[i].push_back(42);
    }
    for (size_t j = 0; j <= i; j++)
      r11[i].push_back(31);
  }

  rules[8] = r8;
  rules[11] = r11;

  auto a2 = validate(messages, rules);

  std::cout << "Part 2: " << a2 << std::endl;

  std::cout << a1 << "\n" << a2 << "\n";
}